

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O0

void __thiscall EDLines::JoinCollinearLines(EDLines *this)

{
  int iVar1;
  bool bVar2;
  int changeIndex;
  reference pvVar3;
  reference pvVar4;
  int local_28;
  int local_24;
  int j;
  int count;
  int firstLineIndex;
  int segmentNo;
  int i;
  int lastLineIndex;
  EDLines *this_local;
  
  segmentNo = -1;
  for (firstLineIndex = 0; firstLineIndex < this->linesNo;
      firstLineIndex = local_24 + firstLineIndex) {
    pvVar3 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                       (&this->lines,(long)firstLineIndex);
    iVar1 = pvVar3->segmentNo;
    changeIndex = segmentNo + 1;
    if (changeIndex != firstLineIndex) {
      pvVar3 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                         (&this->lines,(long)firstLineIndex);
      pvVar4 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                         (&this->lines,(long)changeIndex);
      memcpy(pvVar4,pvVar3,0x44);
    }
    local_24 = 1;
    segmentNo = changeIndex;
    local_28 = firstLineIndex;
    while ((local_28 = local_28 + 1, local_28 < this->linesNo &&
           (pvVar3 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                               (&this->lines,(long)local_28), pvVar3->segmentNo == iVar1))) {
      pvVar3 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                         (&this->lines,(long)segmentNo);
      pvVar4 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                         (&this->lines,(long)local_28);
      bVar2 = TryToJoinTwoLineSegments(this,pvVar3,pvVar4,segmentNo);
      if ((!bVar2) && (segmentNo = segmentNo + 1, segmentNo != local_28)) {
        pvVar3 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                           (&this->lines,(long)local_28);
        pvVar4 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                           (&this->lines,(long)segmentNo);
        memcpy(pvVar4,pvVar3,0x44);
      }
      local_24 = local_24 + 1;
    }
    if (changeIndex != segmentNo) {
      pvVar3 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                         (&this->lines,(long)changeIndex);
      pvVar4 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                         (&this->lines,(long)segmentNo);
      bVar2 = TryToJoinTwoLineSegments(this,pvVar3,pvVar4,changeIndex);
      if (bVar2) {
        segmentNo = segmentNo + -1;
      }
    }
  }
  this->linesNo = segmentNo + 1;
  return;
}

Assistant:

void EDLines::JoinCollinearLines()
{
	int lastLineIndex = -1;   //Index of the last line in the joined lines
	int i = 0;
	while (i < linesNo) {
		int segmentNo = lines[i].segmentNo;

		lastLineIndex++;
		if (lastLineIndex != i) 
			lines[lastLineIndex] = lines[i];
		
		int firstLineIndex = lastLineIndex;  // Index of the first line in this segment

		int count = 1;
		for (int j = i + 1; j< linesNo; j++) {
			if (lines[j].segmentNo != segmentNo) break;

			// Try to combine this line with the previous line in this segment
			if (TryToJoinTwoLineSegments(&lines[lastLineIndex], &lines[j],
				lastLineIndex) == false) {
				lastLineIndex++;
				if (lastLineIndex != j) 
					lines[lastLineIndex] = lines[j];
				
			} //end-if

			count++;
		} //end-for

		  // Try to join the first & last line of this segment
		if (firstLineIndex != lastLineIndex) {
			if (TryToJoinTwoLineSegments(&lines[firstLineIndex], &lines[lastLineIndex],
				firstLineIndex)) {
				lastLineIndex--;
			} //end-if
		} //end-if

		i += count;
	} //end-while

	linesNo = lastLineIndex + 1;
}